

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O0

void re2::RE2FullMatchBraces(void)

{
  bool bVar1;
  ostream *poVar2;
  LogMessage local_768;
  RE2 local_5e8;
  StringPiece local_508;
  LogMessage local_4f8;
  RE2 local_378;
  StringPiece local_298;
  LogMessage local_288;
  RE2 local_f8;
  StringPiece local_18;
  
  StringPiece::StringPiece(&local_18,"0abcd");
  RE2::RE2(&local_f8,"[0-9a-f+.-]{5,}");
  bVar1 = RE2::FullMatch<>(&local_18,&local_f8);
  RE2::~RE2(&local_f8);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_288,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x398);
    poVar2 = LogMessage::stream(&local_288);
    std::operator<<(poVar2,"Check failed: RE2::FullMatch(\"0abcd\", \"[0-9a-f+.-]{5,}\")");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_288);
  }
  StringPiece::StringPiece(&local_298,"0abcde");
  RE2::RE2(&local_378,"[0-9a-f+.-]{5,}");
  bVar1 = RE2::FullMatch<>(&local_298,&local_378);
  RE2::~RE2(&local_378);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_4f8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x399);
    poVar2 = LogMessage::stream(&local_4f8);
    std::operator<<(poVar2,"Check failed: RE2::FullMatch(\"0abcde\", \"[0-9a-f+.-]{5,}\")");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_4f8);
  }
  StringPiece::StringPiece(&local_508,"0abc");
  RE2::RE2(&local_5e8,"[0-9a-f+.-]{5,}");
  bVar1 = RE2::FullMatch<>(&local_508,&local_5e8);
  RE2::~RE2(&local_5e8);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_768,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x39a);
    poVar2 = LogMessage::stream(&local_768);
    std::operator<<(poVar2,"Check failed: !RE2::FullMatch(\"0abc\", \"[0-9a-f+.-]{5,}\")");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_768);
  }
  return;
}

Assistant:

TEST(RE2, FullMatchBraces) {
  // Braces
  CHECK(RE2::FullMatch("0abcd",  "[0-9a-f+.-]{5,}"));
  CHECK(RE2::FullMatch("0abcde", "[0-9a-f+.-]{5,}"));
  CHECK(!RE2::FullMatch("0abc",  "[0-9a-f+.-]{5,}"));
}